

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink.h
# Opt level: O2

double __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex>::log
          (ansicolor_sink<spdlog::details::console_stdout,_spdlog::details::console_mutex> *this,
          double __x)

{
  pthread_mutex_t *__mutex;
  mapped_type *color_code;
  size_t start;
  long in_RSI;
  double extraout_XMM0_Qa;
  memory_buffer formatted;
  memory_buffer local_230;
  
  __mutex = (pthread_mutex_t *)this->mutex_;
  std::mutex::lock((mutex *)&__mutex->__data);
  local_230.super_basic_buffer<char>.ptr_ = local_230.store_;
  local_230.super_basic_buffer<char>.size_ = 0;
  local_230.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00207e98;
  local_230.super_basic_buffer<char>.capacity_ = 500;
  (*((this->super_sink).formatter_._M_t.
     super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
     super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
     super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl)->_vptr_formatter[2])();
  if ((this->should_do_colors_ == true) && (*(ulong *)(in_RSI + 0x28) < *(ulong *)(in_RSI + 0x30)))
  {
    print_range_(this,&local_230,0,*(ulong *)(in_RSI + 0x28));
    color_code = std::__detail::
                 _Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<spdlog::level::level_enum,_std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_spdlog::level::level_enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spdlog::level::level_enum>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->colors_,(key_type *)(in_RSI + 8));
    print_ccode_(this,color_code);
    print_range_(this,&local_230,*(size_t *)(in_RSI + 0x28),*(size_t *)(in_RSI + 0x30));
    print_ccode_(this,&this->reset);
    start = *(size_t *)(in_RSI + 0x30);
  }
  else {
    start = 0;
  }
  print_range_(this,&local_230,start,local_230.super_basic_buffer<char>.size_);
  fflush((FILE *)this->target_file_);
  ::fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            (&local_230);
  pthread_mutex_unlock(__mutex);
  return extraout_XMM0_Qa;
}

Assistant:

void log(const details::log_msg &msg) override
    {
        // Wrap the originally formatted message in color codes.
        // If color is not supported in the terminal, log as is instead.
        std::lock_guard<mutex_t> lock(mutex_);

        fmt::memory_buffer formatted;
        formatter_->format(msg, formatted);
        if (should_do_colors_ && msg.color_range_end > msg.color_range_start)
        {
            // before color range
            print_range_(formatted, 0, msg.color_range_start);
            // in color range
            print_ccode_(colors_[msg.level]);
            print_range_(formatted, msg.color_range_start, msg.color_range_end);
            print_ccode_(reset);
            // after color range
            print_range_(formatted, msg.color_range_end, formatted.size());
        }
        else // no color
        {
            print_range_(formatted, 0, formatted.size());
        }
        fflush(target_file_);
    }